

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

int checkAllBoolHaveAIGPointer(ltlNode *topASTNode)

{
  tokenType tVar1;
  int iVar2;
  bool local_1d;
  ltlNode *topASTNode_local;
  
  tVar1 = topASTNode->type;
  if (OR < tVar1) {
    if (tVar1 == NOT) {
LAB_00735cca:
      if (topASTNode->left == (ltlNode_t *)0x0) {
        __assert_fail("topASTNode->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x333,"int checkAllBoolHaveAIGPointer(ltlNode *)");
      }
      if (topASTNode->right == (ltlNode_t *)0x0) {
        iVar2 = checkAllBoolHaveAIGPointer(topASTNode->left);
        return iVar2;
      }
      __assert_fail("topASTNode->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x334,"int checkAllBoolHaveAIGPointer(ltlNode *)");
    }
    if (tVar1 != IMPLY) {
      if (tVar1 - GLOBALLY < 3) goto LAB_00735cca;
      if (tVar1 != UNTIL) {
        if (tVar1 != BOOL) {
          printf("\nUNSUPPORTED LTL NODE TYPE:: Aborting execution\n");
          exit(0);
        }
        if (topASTNode->pObj != (Aig_Obj_t *)0x0) {
          return 1;
        }
        printf("\nfaulting PODMANDYO topASTNode->name = %s\n",topASTNode->name);
        return 0;
      }
    }
  }
  if (topASTNode->left == (ltlNode_t *)0x0) {
    __assert_fail("topASTNode->left != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                  ,0x32b,"int checkAllBoolHaveAIGPointer(ltlNode *)");
  }
  if (topASTNode->right != (ltlNode_t *)0x0) {
    iVar2 = checkAllBoolHaveAIGPointer(topASTNode->left);
    local_1d = false;
    if (iVar2 != 0) {
      iVar2 = checkAllBoolHaveAIGPointer(topASTNode->right);
      local_1d = iVar2 != 0;
    }
    return (uint)local_1d;
  }
  __assert_fail("topASTNode->right != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                ,0x32c,"int checkAllBoolHaveAIGPointer(ltlNode *)");
}

Assistant:

int checkAllBoolHaveAIGPointer( ltlNode *topASTNode )
{
	
	switch( topASTNode->type ){
		case BOOL:
			if( topASTNode->pObj != NULL )
				return 1;
			else
			{
				printf("\nfaulting PODMANDYO topASTNode->name = %s\n", topASTNode->name);
				return 0;
			}
		case AND:
		case OR:
		case IMPLY:
		case UNTIL:
			assert( topASTNode->left != NULL );
			assert( topASTNode->right != NULL );
			return checkAllBoolHaveAIGPointer( topASTNode->left ) && checkAllBoolHaveAIGPointer( topASTNode->right );
			
		case NOT:
		case NEXT:
		case GLOBALLY:
		case EVENTUALLY:
			assert( topASTNode->left != NULL );
			assert( topASTNode->right == NULL );
			return checkAllBoolHaveAIGPointer( topASTNode->left );
		default:
			printf("\nUNSUPPORTED LTL NODE TYPE:: Aborting execution\n");
			exit(0);
	}
}